

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O0

void __thiscall
TileWire::_checkForInvalidState
          (TileWire *this,State targetState,State *state,FollowWireStage *stage)

{
  int *in_RCX;
  int *in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  TileWire *unaff_retaddr;
  
  if (*in_RCX == 0) {
    if (in_ESI != 3) {
      *in_RCX = 1;
    }
    if (*in_RDX != in_ESI) {
      *in_RDX = in_ESI;
      _fixTraversedWires(unaff_retaddr,(State)((ulong)in_RDI >> 0x20));
    }
  }
  else if ((in_ESI != 3) && (*in_RDX != in_ESI)) {
    *in_RCX = 2;
  }
  return;
}

Assistant:

void TileWire::_checkForInvalidState(State targetState, State& state, FollowWireStage& stage) const {
    if (stage == INITIAL_STAGE) {
        if (targetState != MIDDLE) {
            stage = INPUT_FOUND;
        }
        if (state != targetState) {
            state = targetState;
            _fixTraversedWires(state);
        }
    } else if (targetState != MIDDLE && state != targetState) {
        stage = INVALID_STAGE;
    }
}